

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32m68k.c
# Opt level: O1

uint8_t m68k_reloc_vlink2elf(Reloc *r)

{
  byte bVar1;
  uint8_t uVar2;
  bool bVar3;
  
  bVar3 = isstdreloc(r,'\x01',0x20);
  uVar2 = '\x01';
  if (bVar3 == 0) {
    bVar3 = isstdreloc(r,'\x01',0x10);
    uVar2 = '\x02';
    if (bVar3 == 0) {
      bVar3 = isstdreloc(r,'\x01',8);
      uVar2 = '\x03';
      if (bVar3 == 0) {
        bVar3 = isstdreloc(r,'\x02',0x20);
        uVar2 = '\x04';
        if (bVar3 == 0) {
          bVar3 = isstdreloc(r,'\x02',0x10);
          uVar2 = '\x05';
          if (bVar3 == 0) {
            bVar3 = isstdreloc(r,'\x02',8);
            uVar2 = '\x06';
            if (bVar3 == 0) {
              bVar3 = isstdreloc(r,'\x03',0x20);
              uVar2 = '\a';
              if (bVar3 == 0) {
                bVar3 = isstdreloc(r,'\x03',0x10);
                uVar2 = '\b';
                if (bVar3 == 0) {
                  bVar3 = isstdreloc(r,'\x03',8);
                  uVar2 = '\t';
                  if (bVar3 == 0) {
                    bVar3 = isstdreloc(r,'\x05',0x20);
                    uVar2 = '\n';
                    if (bVar3 == 0) {
                      bVar3 = isstdreloc(r,'\x05',0x10);
                      uVar2 = '\v';
                      if (bVar3 == 0) {
                        bVar3 = isstdreloc(r,'\x05',8);
                        uVar2 = '\f';
                        if (bVar3 == 0) {
                          bVar3 = isstdreloc(r,'\a',0x20);
                          uVar2 = '\r';
                          if (bVar3 == 0) {
                            bVar3 = isstdreloc(r,'\a',0x10);
                            uVar2 = '\x0e';
                            if (bVar3 == 0) {
                              bVar3 = isstdreloc(r,'\a',8);
                              uVar2 = '\x0f';
                              if (bVar3 == 0) {
                                bVar3 = isstdreloc(r,'\t',0x20);
                                uVar2 = '\x10';
                                if (bVar3 == 0) {
                                  bVar3 = isstdreloc(r,'\t',0x10);
                                  uVar2 = '\x11';
                                  if (bVar3 == 0) {
                                    bVar3 = isstdreloc(r,'\t',8);
                                    uVar2 = '\x12';
                                    if (bVar3 == 0) {
                                      bVar1 = r->rtype - 6;
                                      if (bVar1 < 10) {
                                        uVar2 = (&DAT_0012d240)[bVar1];
                                      }
                                      else {
                                        uVar2 = '\0';
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static uint8_t m68k_reloc_vlink2elf(struct Reloc *r)
/* Try to map vlink-internal representation to a valid ELF reloc type */
{
  if (isstdreloc(r,R_ABS,32)) return R_68K_32;
  else if (isstdreloc(r,R_ABS,16)) return R_68K_16;
  else if (isstdreloc(r,R_ABS,8)) return R_68K_8;
  else if (isstdreloc(r,R_PC,32)) return R_68K_PC32;
  else if (isstdreloc(r,R_PC,16)) return R_68K_PC16;
  else if (isstdreloc(r,R_PC,8)) return R_68K_PC8;
  else if (isstdreloc(r,R_GOT,32)) return R_68K_GOT32;
  else if (isstdreloc(r,R_GOT,16)) return R_68K_GOT16;
  else if (isstdreloc(r,R_GOT,8)) return R_68K_GOT8;
  else if (isstdreloc(r,R_GOTOFF,32)) return R_68K_GOT32O;
  else if (isstdreloc(r,R_GOTOFF,16)) return R_68K_GOT16O;
  else if (isstdreloc(r,R_GOTOFF,8)) return R_68K_GOT8O;
  else if (isstdreloc(r,R_PLT,32)) return R_68K_PLT32;
  else if (isstdreloc(r,R_PLT,16)) return R_68K_PLT16;
  else if (isstdreloc(r,R_PLT,8)) return R_68K_PLT8;
  else if (isstdreloc(r,R_PLTOFF,32)) return R_68K_PLT32O;
  else if (isstdreloc(r,R_PLTOFF,16)) return R_68K_PLT16O;
  else if (isstdreloc(r,R_PLTOFF,8)) return R_68K_PLT8O;
  else if (r->rtype == R_COPY) return R_68K_COPY;
  else if (r->rtype == R_GLOBDAT) return R_68K_GLOB_DAT;
  else if (r->rtype == R_JMPSLOT) return R_68K_JMP_SLOT;
  else if (r->rtype == R_LOADREL) return R_68K_RELATIVE;

  return R_NONE;
}